

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::LoadRevisions(cmCTestGIT *this)

{
  ostream *poVar1;
  cmsysProcess *cp;
  char **cmd;
  char **cmd_00;
  char *git_diff_tree [9];
  OutputLogger err;
  string range;
  char *git_rev_list [6];
  CommitParser out;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).OldRevision,"..");
  std::operator+(&range,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&out);
  git_diff_tree[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  git_rev_list[1] = "rev-list";
  git_rev_list[2] = "--reverse";
  git_rev_list[3] = range._M_dataplus._M_p;
  git_rev_list[4] = "--";
  git_rev_list[5] = (char *)0x0;
  git_diff_tree[1] = "diff-tree";
  git_diff_tree[2] = "--stdin";
  git_diff_tree[3] = "--always";
  git_diff_tree[4] = "-z";
  git_diff_tree[5] = "-r";
  git_diff_tree[6] = "--pretty=raw";
  git_diff_tree[7] = "--encoding=utf-8";
  git_diff_tree[8] = (char *)0x0;
  poVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  git_rev_list[0] = git_diff_tree[0];
  cmCTestVC::ComputeCommandLine_abi_cxx11_((string *)&out,(cmCTestVC *)git_rev_list,cmd);
  poVar1 = std::operator<<(poVar1,(string *)&out);
  poVar1 = std::operator<<(poVar1," | ");
  cmCTestVC::ComputeCommandLine_abi_cxx11_((string *)&err,(cmCTestVC *)git_diff_tree,cmd_00);
  poVar1 = std::operator<<(poVar1,(string *)&err);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&out);
  cp = cmsysProcess_New();
  cmsysProcess_AddCommand(cp,git_rev_list);
  cmsysProcess_AddCommand(cp,git_diff_tree);
  cmsysProcess_SetWorkingDirectory
            (cp,(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p);
  CommitParser::CommitParser(&out,this,"dt-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"dt-err> ");
  cmProcessTools::RunProcess(cp,(OutputParser *)&out,(OutputParser *)&err,UTF8);
  (*out.super_DiffParser.super_LineParser.super_OutputParser._vptr_OutputParser[2])(&out,"",1);
  cmsysProcess_Delete(cp);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  CommitParser::~CommitParser(&out);
  std::__cxx11::string::~string((string *)&range);
  return true;
}

Assistant:

bool cmCTestGIT::LoadRevisions()
{
  // Use 'git rev-list ... | git diff-tree ...' to get revisions.
  std::string range = this->OldRevision + ".." + this->NewRevision;
  const char* git = this->CommandLineTool.c_str();
  const char* git_rev_list[] = { git,           "rev-list", "--reverse",
                                 range.c_str(), "--",       nullptr };
  const char* git_diff_tree[] = {
    git,  "diff-tree",    "--stdin",          "--always", "-z",
    "-r", "--pretty=raw", "--encoding=utf-8", nullptr
  };
  this->Log << cmCTestGIT::ComputeCommandLine(git_rev_list) << " | "
            << cmCTestGIT::ComputeCommandLine(git_diff_tree) << "\n";

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_AddCommand(cp, git_rev_list);
  cmsysProcess_AddCommand(cp, git_diff_tree);
  cmsysProcess_SetWorkingDirectory(cp, this->SourceDirectory.c_str());

  CommitParser out(this, "dt-out> ");
  OutputLogger err(this->Log, "dt-err> ");
  cmCTestGIT::RunProcess(cp, &out, &err, cmProcessOutput::UTF8);

  // Send one extra zero-byte to terminate the last record.
  out.Process("", 1);

  cmsysProcess_Delete(cp);
  return true;
}